

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# usdMtlx.cc
# Opt level: O0

bool tinyusdz::detail::ParseMaterialXValue<int>(string *str,int *value,string *err)

{
  bool bVar1;
  uint8_t *binary;
  uint64_t length;
  int local_514;
  undefined1 local_510 [4];
  int val;
  AsciiParser parser;
  StreamReader sr;
  string *err_local;
  int *value_local;
  string *str_local;
  
  binary = (uint8_t *)::std::__cxx11::string::data();
  length = ::std::__cxx11::string::size();
  StreamReader::StreamReader((StreamReader *)&parser._primspec_fun._M_invoker,binary,length,false);
  ascii::AsciiParser::AsciiParser
            ((AsciiParser *)local_510,(StreamReader *)&parser._primspec_fun._M_invoker);
  local_514 = 0;
  bVar1 = ParseValue<int>((AsciiParser *)local_510,&local_514,err);
  if (bVar1) {
    *value = local_514;
  }
  ascii::AsciiParser::~AsciiParser((AsciiParser *)local_510);
  return bVar1;
}

Assistant:

bool ParseMaterialXValue(const std::string &str, T *value, std::string *err) {
  tinyusdz::StreamReader sr(reinterpret_cast<const uint8_t *>(str.data()),
                            str.size(), /* swap endian */ false);
  tinyusdz::ascii::AsciiParser parser(&sr);

  T val{};

  if (!ParseValue(parser, val, err)) {
    return false;
  }

  (*value) = val;
  return true;
}